

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

SimpleString PrintableStringFromOrNull(char *expected)

{
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar1;
  char *in_RSI;
  SimpleString SVar2;
  SimpleString local_20;
  
  if (in_RSI == (char *)0x0) {
    expected[0] = '\0';
    expected[1] = '\0';
    expected[2] = '\0';
    expected[3] = '\0';
    expected[4] = '\0';
    expected[5] = '\0';
    expected[6] = '\0';
    expected[7] = '\0';
    expected[8] = '\0';
    expected[9] = '\0';
    expected[10] = '\0';
    expected[0xb] = '\0';
    expected[0xc] = '\0';
    expected[0xd] = '\0';
    expected[0xe] = '\0';
    expected[0xf] = '\0';
    SimpleString::copyBufferToNewInternalBuffer((SimpleString *)expected,"(null)");
    sVar1 = extraout_RDX_00;
  }
  else {
    SimpleString::SimpleString(&local_20,in_RSI);
    SimpleString::printable((SimpleString *)expected);
    SimpleString::deallocateInternalBuffer(&local_20);
    sVar1 = extraout_RDX;
  }
  SVar2.bufferSize_ = sVar1;
  SVar2.buffer_ = expected;
  return SVar2;
}

Assistant:

SimpleString PrintableStringFromOrNull(const char * expected)
{
    return (expected) ? StringFrom(expected).printable() : StringFrom("(null)");
}